

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_jsonmodelserialiser.cpp
# Opt level: O3

void JsonModelSerialiser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  JsonFormat JVar4;
  QJsonObject _r;
  undefined8 local_10;
  
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      setFormat((JsonModelSerialiser *)_o,*_a[1]);
      return;
    case 1:
      (**(code **)(*(long *)_o + 0xd0))(&local_10,_o);
      puVar1 = (undefined8 *)*_a;
      if (puVar1 != (undefined8 *)0x0) {
        uVar2 = *puVar1;
        *puVar1 = local_10;
        local_10 = uVar2;
      }
      QJsonObject::~QJsonObject((QJsonObject *)&local_10);
      break;
    case 2:
      uVar3 = (**(code **)(*(long *)_o + 0xd8))(_o,_a[1]);
      if ((undefined1 *)*_a != (undefined1 *)0x0) {
        *(undefined1 *)*_a = uVar3;
      }
      break;
    case 3:
      JVar4 = format((JsonModelSerialiser *)_o);
      if ((JsonFormat *)*_a != (JsonFormat *)0x0) {
        *(JsonFormat *)*_a = JVar4;
      }
    }
  }
  return;
}

Assistant:

void JsonModelSerialiser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<JsonModelSerialiser *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->setFormat((*reinterpret_cast< std::add_pointer_t<QJsonDocument::JsonFormat>>(_a[1]))); break;
        case 1: { QJsonObject _r = _t->toJsonObject();
            if (_a[0]) *reinterpret_cast< QJsonObject*>(_a[0]) = std::move(_r); }  break;
        case 2: { bool _r = _t->fromJsonObject((*reinterpret_cast< std::add_pointer_t<QJsonObject>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 3: { QJsonDocument::JsonFormat _r = _t->format();
            if (_a[0]) *reinterpret_cast< QJsonDocument::JsonFormat*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
}